

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_messages_proto3.upb.h
# Opt level: O2

bool protobuf_test_messages_proto3_TestAllTypesProto3_add_repeated_int32
               (protobuf_test_messages_proto3_TestAllTypesProto3 *msg,int32_t val,upb_Arena *arena)

{
  bool bVar1;
  upb_Array *array;
  int32_t val_local;
  upb_MiniTableField field;
  
  field.number_dont_copy_me__upb_internal_use_only = 0x1f;
  field.offset_dont_copy_me__upb_internal_use_only = 0x118;
  field.presence = 0;
  field.submsg_index_dont_copy_me__upb_internal_use_only = 0xffff;
  field.descriptortype_dont_copy_me__upb_internal_use_only = '\x05';
  field.mode_dont_copy_me__upb_internal_use_only = 0xc5;
  val_local = val;
  array = upb_Message_GetOrCreateMutableArray
                    (&msg->base_dont_copy_me__upb_internal_use_only,&field,arena);
  if ((array != (upb_Array *)0x0) &&
     (bVar1 = _upb_Array_ResizeUninitialized_dont_copy_me__upb_internal_use_only
                        (array,array->size_dont_copy_me__upb_internal_use_only + 1,arena), bVar1)) {
    _upb_Array_Set_dont_copy_me__upb_internal_use_only
              (array,array->size_dont_copy_me__upb_internal_use_only - 1,&val_local,4);
    return true;
  }
  return false;
}

Assistant:

UPB_INLINE bool protobuf_test_messages_proto3_TestAllTypesProto3_add_repeated_int32(protobuf_test_messages_proto3_TestAllTypesProto3* msg, int32_t val, upb_Arena* arena) {
  upb_MiniTableField field = {31, UPB_SIZE(60, 280), 0, kUpb_NoSub, 5, (int)kUpb_FieldMode_Array | (int)kUpb_LabelFlags_IsPacked | ((int)UPB_SIZE(kUpb_FieldRep_4Byte, kUpb_FieldRep_8Byte) << kUpb_FieldRep_Shift)};
  upb_Array* arr = upb_Message_GetOrCreateMutableArray(
      UPB_UPCAST(msg), &field, arena);
  if (!arr || !UPB_PRIVATE(_upb_Array_ResizeUninitialized)(
                  arr, arr->UPB_PRIVATE(size) + 1, arena)) {
    return false;
  }
  UPB_PRIVATE(_upb_Array_Set)
  (arr, arr->UPB_PRIVATE(size) - 1, &val, sizeof(val));
  return true;
}